

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void lj_err_lex(lua_State *L,GCstr *src,char *tok,BCLine line,ErrMsg em,__va_list_tag *argp)

{
  char *pcVar1;
  lua_State *L_00;
  uint in_ECX;
  long in_RDX;
  lua_State *in_RDI;
  char *msg;
  char buff [60];
  __va_list_tag *in_stack_000000b8;
  char *in_stack_000000c0;
  lua_State *in_stack_000000c8;
  int in_stack_ffffffffffffff8c;
  undefined1 local_68 [12];
  BCLine in_stack_ffffffffffffffa4;
  GCstr *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  
  lj_debug_shortname(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  pcVar1 = lj_strfmt_pushvf(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
  L_00 = (lua_State *)lj_strfmt_pushf(in_RDI,"%s:%d: %s",local_68,(ulong)in_ECX,pcVar1);
  if (in_RDX != 0) {
    lj_strfmt_pushf(in_RDI,lj_err_allmsg + 0x8c9,L_00,in_RDX);
  }
  lj_err_throw(L_00,in_stack_ffffffffffffff8c);
}

Assistant:

LJ_NOINLINE void lj_err_lex(lua_State *L, GCstr *src, const char *tok,
			    BCLine line, ErrMsg em, va_list argp)
{
  char buff[LUA_IDSIZE];
  const char *msg;
  lj_debug_shortname(buff, src, line);
  msg = lj_strfmt_pushvf(L, err2msg(em), argp);
  msg = lj_strfmt_pushf(L, "%s:%d: %s", buff, line, msg);
  if (tok)
    lj_strfmt_pushf(L, err2msg(LJ_ERR_XNEAR), msg, tok);
  lj_err_throw(L, LUA_ERRSYNTAX);
}